

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O2

double __thiscall Valve::getSetting(Valve *this,Network *nw)

{
  ValveType VVar1;
  
  VVar1 = this->valveType;
  if (PSV < VVar1) {
    if (VVar1 == FCV) {
      return (this->super_Link).setting * (nw->units).factors[5];
    }
    if (VVar1 != PBV) {
      return (this->super_Link).setting;
    }
  }
  return (this->super_Link).setting * (nw->units).factors[4];
}

Assistant:

double Valve::getSetting(Network* nw)
{
    switch(valveType)
    {
    case PRV:
    case PSV:
    case PBV: return setting * nw->ucf(Units::PRESSURE);
    case FCV: return setting * nw->ucf(Units::FLOW);
    default:  return setting;
    }
}